

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void __thiscall Fl_Widget::damage(Fl_Widget *this,uchar fl)

{
  byte bVar1;
  int X;
  int Y;
  int W;
  int H;
  Fl_X *pFVar2;
  Fl_X *i;
  uchar fl_local;
  Fl_Widget *this_local;
  
  bVar1 = type(this);
  if (bVar1 < 0xf0) {
    X = x(this);
    Y = y(this);
    W = w(this);
    H = h(this);
    damage(this,fl,X,Y,W,H);
  }
  else {
    pFVar2 = Fl_X::i((Fl_Window *)this);
    if (pFVar2 != (Fl_X *)0x0) {
      if (pFVar2->region != (Fl_Region)0x0) {
        XDestroyRegion(pFVar2->region);
        pFVar2->region = (Fl_Region)0x0;
      }
      this->damage_ = this->damage_ | fl;
      Fl::damage(1);
    }
  }
  return;
}

Assistant:

void Fl_Widget::damage(uchar fl) {
  if (type() < FL_WINDOW) {
    // damage only the rectangle covered by a child widget:
    damage(fl, x(), y(), w(), h());
  } else {
    // damage entire window by deleting the region:
    Fl_X* i = Fl_X::i((Fl_Window*)this);
    if (!i) return; // window not mapped, so ignore it
    if (i->region) {XDestroyRegion(i->region); i->region = 0;}
    damage_ |= fl;
    Fl::damage(FL_DAMAGE_CHILD);
  }
}